

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O0

int find_text(char **texts,size_t n_texts,char *key)

{
  int iVar1;
  size_t sVar2;
  ulong local_30;
  size_t ind;
  char *key_local;
  size_t n_texts_local;
  char **texts_local;
  
  if ((((texts != (char **)0x0) && (n_texts != 0)) && (key != (char *)0x0)) &&
     (sVar2 = strlen(key), sVar2 != 0)) {
    local_30 = 0;
    while( true ) {
      if (n_texts <= local_30) {
        return -1;
      }
      iVar1 = strcmp(texts[local_30],key);
      if (iVar1 == 0) break;
      local_30 = local_30 + 1;
    }
    return (int)local_30;
  }
  return -1;
}

Assistant:

int 
find_text(char* const* texts, size_t n_texts, const char* key) 
{
	size_t ind;
	
	/* if there's not where to find, return nothing was found */
	if ((NULL == texts) || (0 == n_texts)) {
		return -1;
	}
	
	/* if there's not what to find, return nothing was found */
	if ( (NULL == key) || (0 == strlen(key)) ) {
		return -1;
	}
	
	for (ind = 0; ind < n_texts; ind++) {
		if (!strcmp(texts[ind], key)) {
			return ind;
		}
	}
	
	return -1;
}